

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O1

void __thiscall S2LaxPolygonShape::S2LaxPolygonShape(S2LaxPolygonShape *this,S2Polygon *polygon)

{
  (this->super_S2Shape).id_ = -1;
  (this->super_S2Shape)._vptr_S2Shape = (_func_int **)&PTR__S2LaxPolygonShape_002c2208;
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = (Vector3<double> *)0x0;
  Init(this,polygon);
  return;
}

Assistant:

S2LaxPolygonShape::S2LaxPolygonShape(const S2Polygon& polygon) {
  Init(polygon);
}